

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O0

void __thiscall
H264StreamReader::additionalStreamCheck(H264StreamReader *this,uint8_t *buff,uint8_t *end)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint8_t *puVar5;
  ostream *this_00;
  SPSUnit *pSVar6;
  byte local_589;
  byte local_579;
  int local_544;
  byte *pbStack_540;
  int picOrder;
  uint8_t *nal_2;
  byte *pbStack_530;
  int frameNum;
  uint8_t *nal_1;
  PPSUnit pps2;
  uint8_t *nal;
  bool tmpspsfound;
  uint8_t *nalEnd;
  SEIUnit sei;
  int rez;
  bool differPPS;
  PPSUnit pps1;
  undefined1 local_2a8 [8];
  SPSUnit tmpsps;
  SliceUnit slice;
  bool SEIFound;
  uint8_t *end_local;
  uint8_t *buff_local;
  H264StreamReader *this_local;
  
  slice.sps._7_1_ = 0;
  SliceUnit::SliceUnit
            ((SliceUnit *)
             &tmpsps.view_id.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  SPSUnit::SPSUnit((SPSUnit *)local_2a8);
  PPSUnit::PPSUnit((PPSUnit *)&rez);
  sei.m_mvcHeaderStart._7_1_ = 0;
  sei.m_mvcHeaderStart._0_4_ = 0;
  SEIUnit::SEIUnit((SEIUnit *)&nalEnd);
  bVar2 = false;
  for (pps2._80_8_ = NALUnit::findNextNAL(buff,end); (uint8_t *)pps2._80_8_ != end;
      pps2._80_8_ = NALUnit::findNextNAL((uint8_t *)pps2._80_8_,end)) {
    switch(*(byte *)pps2._80_8_ & 0x1f) {
    case 6:
      if ((bVar2) &&
         (puVar5 = NALUnit::findNALWithStartCode((uint8_t *)pps2._80_8_,end,true), puVar5 != end)) {
        NALUnit::decodeBuffer((NALUnit *)&nalEnd,(uint8_t *)pps2._80_8_,puVar5);
        local_579 = 1;
        if ((this->orig_hrd_parameters_present_flag & 1U) == 0) {
          local_579 = this->orig_vcl_parameters_present_flag;
        }
        SEIUnit::deserialize((SEIUnit *)&nalEnd,(SPSUnit *)local_2a8,local_579 & 1);
        bVar1 = SEIUnit::hasProcessedMessage((SEIUnit *)&nalEnd,0);
        if ((bVar1) || (bVar1 = SEIUnit::hasProcessedMessage((SEIUnit *)&nalEnd,1), bVar1)) {
          slice.sps._7_1_ = 1;
        }
        if (-1 < sei.initial_cpb_removal_delay_offset[0x1e]) {
          this->number_of_offset_sequences = sei.initial_cpb_removal_delay_offset[0x1e];
        }
      }
      break;
    case 8:
      PPSUnit::PPSUnit((PPSUnit *)&nal_1);
      puVar5 = NALUnit::findNALWithStartCode
                         ((uint8_t *)pps2._80_8_,
                          (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd,true);
      if ((uint)pps1.super_NALUnit.m_nalBuffer == 0) {
        NALUnit::decodeBuffer((NALUnit *)&rez,(uint8_t *)pps2._80_8_,puVar5);
        PPSUnit::deserialize((PPSUnit *)&rez);
      }
      NALUnit::decodeBuffer((NALUnit *)&nal_1,(uint8_t *)pps2._80_8_,puVar5);
      PPSUnit::deserialize((PPSUnit *)&nal_1);
      if ((pps1.super_NALUnit.bitReader.m_curVal == pps2.super_NALUnit.bitReader.m_curVal) &&
         (((uint)pps2.super_NALUnit.m_nalBuffer != (uint)pps1.super_NALUnit.m_nalBuffer ||
          (iVar3 = memcmp((void *)pps2.super_NALUnit._8_8_,(void *)pps1.super_NALUnit._8_8_,
                          (ulong)(uint)pps1.super_NALUnit.m_nalBuffer), iVar3 != 0)))) {
        sei.m_mvcHeaderStart._7_1_ = 1;
      }
      PPSUnit::~PPSUnit((PPSUnit *)&nal_1);
      break;
    default:
      break;
    case 0xf:
      this->m_mvcSubStream = true;
    case 7:
      puVar5 = NALUnit::findNALWithStartCode
                         ((uint8_t *)pps2._80_8_,
                          (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd,true);
      NALUnit::decodeBuffer((NALUnit *)local_2a8,(uint8_t *)pps2._80_8_,puVar5);
      SPSUnit::deserialize((SPSUnit *)local_2a8);
      this->orig_hrd_parameters_present_flag = (bool)(tmpsps.aspect_ratio_idc & 1);
      this->orig_vcl_parameters_present_flag =
           (bool)(tmpsps.nalHrdParams.initial_cpb_removal_delay_length_minus1 & 1);
      bVar2 = true;
    }
  }
  if ((((this->super_MPEGStreamReader).m_removePulldown & 1U) == 0) &&
     (this->m_insertSEIMethod != SEI_InsertForce)) {
    if (this->m_insertSEIMethod == SEI_InsertAuto) {
      local_589 = 1;
      if (((this->orig_hrd_parameters_present_flag & 1U) != 0) &&
         (local_589 = 1, (this->orig_vcl_parameters_present_flag & 1U) != 0)) {
        local_589 = slice.sps._7_1_ ^ 0xff;
      }
      this->m_needSeiCorrection = (bool)(local_589 & 1);
      if (((this->m_needSeiCorrection & 1U) != 0) && ((sei.m_mvcHeaderStart._7_1_ & 1) != 0)) {
        this_00 = std::operator<<((ostream *)&std::cout,
                                  "H264 stream contains different PPS with same pps_id. SEI correction is turned off"
                                 );
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
        sLastMsg = true;
        this->m_needSeiCorrection = false;
      }
    }
    else {
      this->m_needSeiCorrection = false;
    }
  }
  else {
    this->m_needSeiCorrection = true;
  }
  this->m_forceLsbDiv = -1;
  pbStack_530 = NALUnit::findNextNAL(buff,end);
  do {
    if (pbStack_530 == end) {
      if (this->m_forceLsbDiv == -1) {
        this->m_forceLsbDiv = 1;
      }
      nal_2._4_4_ = -1;
      for (pbStack_540 = NALUnit::findNextNAL(buff,end); pbStack_540 != end;
          pbStack_540 = NALUnit::findNextNAL(pbStack_540,end)) {
        if (((((*pbStack_540 & 0x1f) - 1 < 5) || ((*pbStack_540 & 0x1f) == 0x14)) &&
            (sei.m_mvcHeaderStart._0_4_ =
                  deserializeSliceHeader
                            (this,(SliceUnit *)
                                  &tmpsps.view_id.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage,pbStack_540,end
                            ), (int)sei.m_mvcHeaderStart == 0)) &&
           ((slice.non_idr_flag == 0 &&
            (pSVar6 = SliceUnit::getSPS((SliceUnit *)
                                        &tmpsps.view_id.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage),
            pSVar6->pic_order_cnt_type != 2)))) {
          local_544 = calcPicOrder(this,(SliceUnit *)
                                        &tmpsps.view_id.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
          bVar2 = SliceUnit::isIDR((SliceUnit *)
                                   &tmpsps.view_id.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar2) {
            nal_2._4_4_ = -1;
          }
          bVar2 = SliceUnit::isIFrame((SliceUnit *)
                                      &tmpsps.view_id.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar2) {
            this->m_fieldFirst = slice.pic_parameter_set_id;
          }
          nal_2._4_4_ = nal_2._4_4_ + 1;
          checkPyramid(this,nal_2._4_4_,&local_544,true);
        }
      }
      this->prevPicOrderCntLsb = 0;
      this->prevPicOrderCntMsb = 0;
      SEIUnit::~SEIUnit((SEIUnit *)&nalEnd);
      PPSUnit::~PPSUnit((PPSUnit *)&rez);
      SPSUnit::~SPSUnit((SPSUnit *)local_2a8);
      SliceUnit::~SliceUnit
                ((SliceUnit *)
                 &tmpsps.view_id.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      return;
    }
    uVar4 = *pbStack_530 & 0x1f;
    if (uVar4 - 1 < 5) {
LAB_0029b820:
      sei.m_mvcHeaderStart._0_4_ =
           deserializeSliceHeader
                     (this,(SliceUnit *)
                           &tmpsps.view_id.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,pbStack_530,end);
      if ((int)sei.m_mvcHeaderStart == 0) {
        pSVar6 = SliceUnit::getSPS((SliceUnit *)
                                   &tmpsps.view_id.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        if ((pSVar6->frame_mbs_only_flag == 0) && (slice.super_NALUnit.bitReader.m_curVal != 0)) {
          this->m_forceLsbDiv = 1;
        }
        else if ((uint)slice.frame_num % 2 == 1) {
          this->m_forceLsbDiv = 0;
        }
      }
    }
    else if (uVar4 == 7) {
LAB_0029b7ec:
      processSPS(this,pbStack_530);
    }
    else if (uVar4 == 8) {
      processPPS(this,pbStack_530);
    }
    else {
      if (uVar4 == 0xf) goto LAB_0029b7ec;
      if (uVar4 == 0x14) goto LAB_0029b820;
    }
    pbStack_530 = NALUnit::findNextNAL(pbStack_530,end);
  } while( true );
}

Assistant:

void H264StreamReader::additionalStreamCheck(uint8_t *buff, uint8_t *end)
{
    // Make sure that the stream doesn't appear to be progressive, since pic_order_cnt_lsb doesn't reach values higher
    // than 2 in these streams.
    bool SEIFound = false;
    SliceUnit slice;
    SPSUnit tmpsps;

    PPSUnit pps1;
    bool differPPS = false;

    int rez = 0;
    SEIUnit sei;
    uint8_t *nalEnd = nullptr;
    bool tmpspsfound = false;
    for (uint8_t *nal = NALUnit::findNextNAL(buff, end); nal != end; nal = NALUnit::findNextNAL(nal, end))
    {
        switch (static_cast<NALUnit::NALType>(*nal & 0x1f))
        {
        case NALUnit::NALType::nuSubSPS:
            m_mvcSubStream = true;
            [[fallthrough]];
        case NALUnit::NALType::nuSPS:
            nalEnd = NALUnit::findNALWithStartCode(nal, m_bufEnd, true);
            tmpsps.decodeBuffer(nal, nalEnd);
            tmpsps.deserialize();
            orig_hrd_parameters_present_flag = tmpsps.nalHrdParams.isPresent;
            orig_vcl_parameters_present_flag = tmpsps.vclHrdParams.isPresent;
            tmpspsfound = true;
            break;
        case NALUnit::NALType::nuPPS:
        {
            PPSUnit pps2;
            nalEnd = NALUnit::findNALWithStartCode(nal, m_bufEnd, true);
            if (pps1.m_nalBufferLen == 0)
            {
                pps1.decodeBuffer(nal, nalEnd);
                pps1.deserialize();
            }
            pps2.decodeBuffer(nal, nalEnd);
            pps2.deserialize();
            if (pps1.pic_parameter_set_id == pps2.pic_parameter_set_id)
            {
                if (pps2.m_nalBufferLen != pps1.m_nalBufferLen ||
                    memcmp(pps2.m_nalBuffer, pps1.m_nalBuffer, pps1.m_nalBufferLen) != 0)
                    differPPS = true;
            }
            break;
        }
        case NALUnit::NALType::nuSEI:
            if (tmpspsfound)
            {
                nalEnd = NALUnit::findNALWithStartCode(nal, end, true);
                if (nalEnd == end)
                    break;
                sei.decodeBuffer(nal, nalEnd);
                sei.deserialize(tmpsps, orig_hrd_parameters_present_flag || orig_vcl_parameters_present_flag);
                if (sei.hasProcessedMessage(SEI_MSG_BUFFERING_PERIOD) || sei.hasProcessedMessage(SEI_MSG_PIC_TIMING))
                {
                    SEIFound = true;
                }

                if (sei.number_of_offset_sequences >= 0)
                {
                    number_of_offset_sequences = sei.number_of_offset_sequences;
                }
            }
            break;
        default:
            break;
        }
    }

    if (m_removePulldown || m_insertSEIMethod == SeiMethod::SEI_InsertForce)
        m_needSeiCorrection = true;
    else if (m_insertSEIMethod == SeiMethod::SEI_InsertAuto)
    {
        m_needSeiCorrection =
            orig_hrd_parameters_present_flag == 0 || orig_vcl_parameters_present_flag == 0 || !SEIFound;
        if (m_needSeiCorrection && differPPS)
        {
            LTRACE(LT_INFO, 2, "H264 stream contains different PPS with same pps_id. SEI correction is turned off");
            m_needSeiCorrection = false;
        }
    }
    else
        m_needSeiCorrection = false;

    m_forceLsbDiv = -1;
    for (uint8_t *nal = NALUnit::findNextNAL(buff, end); nal != end; nal = NALUnit::findNextNAL(nal, end))
    {
        switch (static_cast<NALUnit::NALType>(*nal & 0x1f))
        {
        case NALUnit::NALType::nuSPS:
        case NALUnit::NALType::nuSubSPS:
            processSPS(nal);
            break;
        case NALUnit::NALType::nuPPS:
            processPPS(nal);
            break;
        case NALUnit::NALType::nuSliceIDR:
        case NALUnit::NALType::nuSliceNonIDR:
        case NALUnit::NALType::nuSliceA:
        case NALUnit::NALType::nuSliceB:
        case NALUnit::NALType::nuSliceC:
        case NALUnit::NALType::nuSliceExt:
            rez = deserializeSliceHeader(slice, nal, end);
            if (rez == 0)
            {
                // coded fields
                if (slice.getSPS()->frame_mbs_only_flag == 0 && slice.m_field_pic_flag)
                    m_forceLsbDiv = 1;
                // coded frames
                else if (slice.pic_order_cnt_lsb % 2 == 1)
                    m_forceLsbDiv = 0;
            }
            break;
        default:
            break;
        }
    }

    if (m_forceLsbDiv == -1)
        m_forceLsbDiv = 1;

    int frameNum = -1;
    for (uint8_t *nal = NALUnit::findNextNAL(buff, end); nal != end; nal = NALUnit::findNextNAL(nal, end))
    {
        switch (static_cast<NALUnit::NALType>(*nal & 0x1f))
        {
        case NALUnit::NALType::nuSliceIDR:
        case NALUnit::NALType::nuSliceNonIDR:
        case NALUnit::NALType::nuSliceA:
        case NALUnit::NALType::nuSliceB:
        case NALUnit::NALType::nuSliceC:
        case NALUnit::NALType::nuSliceExt:
            rez = deserializeSliceHeader(slice, nal, end);
            if (rez == 0 && slice.first_mb_in_slice == 0 && slice.getSPS()->pic_order_cnt_type != 2)
            {
                int picOrder = calcPicOrder(slice);
                if (slice.isIDR())
                    frameNum = -1;
                if (slice.isIFrame())
                    m_fieldFirst = slice.bottom_field_flag;
                checkPyramid(++frameNum, &picOrder, true);
            }
            break;
        default:
            break;
        }
    }
    prevPicOrderCntMsb = prevPicOrderCntLsb = 0;
}